

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void create_colorindex(j_decompress_ptr cinfo)

{
  J_DITHER_MODE JVar1;
  int iVar2;
  jpeg_color_quantizer *pjVar3;
  undefined1 *puVar4;
  char cVar5;
  int iVar6;
  JSAMPARRAY ppJVar7;
  long lVar8;
  undefined1 *puVar9;
  JDIMENSION JVar10;
  _func_void_j_decompress_ptr *p_Var11;
  char cVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  pjVar3 = cinfo->cquantize;
  JVar1 = cinfo->dither_mode;
  JVar10 = 0x100;
  if (JVar1 == JDITHER_ORDERED) {
    JVar10 = 0x2fe;
  }
  *(uint *)&pjVar3[1].new_color_map = (uint)(JVar1 == JDITHER_ORDERED);
  ppJVar7 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar10,cinfo->out_color_components);
  pjVar3[1].finish_pass = (_func_void_j_decompress_ptr *)ppJVar7;
  iVar6 = *(int *)&pjVar3[1].color_quantize;
  for (lVar15 = 0; lVar15 < cinfo->out_color_components; lVar15 = lVar15 + 1) {
    iVar2 = *(int *)((long)&pjVar3[1].new_color_map + lVar15 * 4 + 4);
    lVar13 = (long)iVar6;
    p_Var11 = pjVar3[1].finish_pass;
    iVar6 = (int)(lVar13 / (long)iVar2);
    if (JVar1 == JDITHER_ORDERED) {
      *(long *)(p_Var11 + lVar15 * 8) = *(long *)(p_Var11 + lVar15 * 8) + 0xff;
      p_Var11 = pjVar3[1].finish_pass;
    }
    puVar4 = *(undefined1 **)(p_Var11 + lVar15 * 8);
    lVar16 = (long)(iVar2 * 2 + -2);
    lVar8 = ((long)iVar2 + 0xfe) / lVar16;
    lVar17 = 0;
    for (lVar18 = 0; lVar18 != 0x100; lVar18 = lVar18 + 1) {
      cVar5 = (char)(lVar13 / (long)iVar2);
      cVar12 = cVar5 * (char)lVar17;
      lVar17 = (long)(int)lVar17;
      lVar14 = lVar17 * 0x1fe + (long)iVar2 + 0x2fc;
      while ((int)lVar8 < lVar18) {
        lVar17 = lVar17 + 1;
        cVar12 = cVar12 + cVar5;
        lVar8 = lVar14 / lVar16;
        lVar14 = lVar14 + 0x1fe;
      }
      puVar4[lVar18] = cVar12;
    }
    if (JVar1 == JDITHER_ORDERED) {
      puVar9 = puVar4 + 0x100;
      lVar13 = 0xff;
      while (lVar13 != 0) {
        puVar4[lVar13 + -0x100] = *puVar4;
        *puVar9 = puVar4[0xff];
        puVar9 = puVar9 + 1;
        lVar13 = lVar13 + -1;
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
create_colorindex(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  JSAMPROW indexptr;
  int i, j, k, nci, blksize, val, pad;

  /* For ordered dither, we pad the color index tables by MAXJSAMPLE in
   * each direction (input index values can be -MAXJSAMPLE .. 2*MAXJSAMPLE).
   * This is not necessary in the other dithering modes.  However, we
   * flag whether it was done in case user changes dithering mode.
   */
  if (cinfo->dither_mode == JDITHER_ORDERED) {
    pad = MAXJSAMPLE * 2;
    cquantize->is_padded = TRUE;
  } else {
    pad = 0;
    cquantize->is_padded = FALSE;
  }

  cquantize->colorindex = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)(MAXJSAMPLE + 1 + pad),
     (JDIMENSION)cinfo->out_color_components);

  /* blksize is number of adjacent repeated entries for a component */
  blksize = cquantize->sv_actual;

  for (i = 0; i < cinfo->out_color_components; i++) {
    /* fill in colorindex entries for i'th color component */
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    blksize = blksize / nci;

    /* adjust colorindex pointers to provide padding at negative indexes. */
    if (pad)
      cquantize->colorindex[i] += MAXJSAMPLE;

    /* in loop, val = index of current output value, */
    /* and k = largest j that maps to current val */
    indexptr = cquantize->colorindex[i];
    val = 0;
    k = largest_input_value(cinfo, i, 0, nci - 1);
    for (j = 0; j <= MAXJSAMPLE; j++) {
      while (j > k)             /* advance val if past boundary */
        k = largest_input_value(cinfo, i, ++val, nci - 1);
      /* premultiply so that no multiplication needed in main processing */
      indexptr[j] = (JSAMPLE)(val * blksize);
    }
    /* Pad at both ends if necessary */
    if (pad)
      for (j = 1; j <= MAXJSAMPLE; j++) {
        indexptr[-j] = indexptr[0];
        indexptr[MAXJSAMPLE + j] = indexptr[MAXJSAMPLE];
      }
  }
}